

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O1

void __thiscall Activation::TracePointers(Activation *this,function<void_(Sexp_**)> *func)

{
  Activation *pAVar1;
  ulong uVar2;
  Activation *local_38;
  
  pAVar1 = (Activation *)
           (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((Activation *)
      (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    uVar2 = 0;
    do {
      if (pAVar1->parent != (Sexp *)0x0) {
        local_38 = pAVar1;
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00113b58;
        (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_38);
      }
      uVar2 = uVar2 + 1;
      pAVar1 = (Activation *)&pAVar1->slots;
    } while (uVar2 < (ulong)((long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (this->parent != (Sexp *)0x0) {
    local_38 = this;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00113b58:
      std::__throw_bad_function_call();
    }
    (*func->_M_invoker)((_Any_data *)func,(Sexp ***)&local_38);
  }
  return;
}

Assistant:

void Activation::TracePointers(std::function<void(Sexp **)> func) {
  Sexp **data = slots.data();
  for (size_t i = 0; i < slots.size(); i++) {
    if (data[i] != nullptr) {
      func(&data[i]);
    }
  }

  if (parent != nullptr) {
    func(&parent);
  }
}